

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O2

long __thiscall glcts::AdvancedManyDrawCalls2::Setup(AdvancedManyDrawCalls2 *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_acbo);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_ssbo);
  glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vao);
  glu::CallLogWrapper::glGenProgramPipelines(this_00,1,&this->m_ppo);
  this->m_vsp = 0;
  this->m_fsp = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		glGenBuffers(1, &m_acbo);
		glGenBuffers(1, &m_ssbo);
		glGenVertexArrays(1, &m_vao);
		glGenProgramPipelines(1, &m_ppo);
		m_vsp = m_fsp = 0;
		return NO_ERROR;
	}